

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::Write
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,TPZStream *str,
          int withclassid)

{
  bool bVar1;
  TPZRefPattern *this_00;
  undefined4 in_EDX;
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *in_RSI;
  long in_RDI;
  int refpatternindex;
  undefined4 in_stack_ffffffffffffffe8;
  
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::Write
            (in_RSI,(TPZStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RDI >> 0x20));
  TPZStream::Write<long>
            ((TPZStream *)in_RSI,(TPZVec<long> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x188));
  if (bVar1) {
    this_00 = TPZAutoPointer<TPZRefPattern>::operator->
                        ((TPZAutoPointer<TPZRefPattern> *)(in_RDI + 0x188));
    TPZRefPattern::Id(this_00);
  }
  (**(code **)(*(long *)&in_RSI->super_TPZGeoEl + 0x18))(in_RSI,&stack0xffffffffffffffe8,1);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Write(TPZStream &str, int withclassid) const {
    TPZGeoElRefLess<TGeo>::Write(str, withclassid);
    str.Write(this->fSubEl);
    int refpatternindex = -1;
    if (fRefPattern) refpatternindex = fRefPattern->Id();
    str.Write(&refpatternindex, 1);
}